

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void discharge2reg(FuncState *fs,expdesc *e,int reg)

{
  uint bc;
  uint *puVar1;
  Instruction *pc;
  int reg_local;
  expdesc *e_local;
  FuncState *fs_local;
  
  luaK_dischargevars(fs,e);
  switch(e->k) {
  case VNIL:
    luaK_nil(fs,reg,1);
    break;
  case VTRUE:
  case VFALSE:
    luaK_codeABC(fs,OP_LOADBOOL,reg,(uint)(e->k == VTRUE),0);
    break;
  case VK:
    luaK_codeABx(fs,OP_LOADK,reg,(e->u).s.info);
    break;
  case VKNUM:
    bc = luaK_numberK(fs,(e->u).nval);
    luaK_codeABx(fs,OP_LOADK,reg,bc);
    break;
  default:
    return;
  case VRELOCABLE:
    puVar1 = fs->f->code + (e->u).s.info;
    *puVar1 = *puVar1 & 0xffffc03f | (reg & 0xffU) << 6;
    break;
  case VNONRELOC:
    if (reg != (e->u).s.info) {
      luaK_codeABC(fs,OP_MOVE,reg,(e->u).s.info,0);
    }
  }
  (e->u).s.info = reg;
  e->k = VNONRELOC;
  return;
}

Assistant:

static void discharge2reg(FuncState*fs,expdesc*e,int reg){
luaK_dischargevars(fs,e);
switch(e->k){
case VNIL:{
luaK_nil(fs,reg,1);
break;
}
case VFALSE:case VTRUE:{
luaK_codeABC(fs,OP_LOADBOOL,reg,e->k==VTRUE,0);
break;
}
case VK:{
luaK_codeABx(fs,OP_LOADK,reg,e->u.s.info);
break;
}
case VKNUM:{
luaK_codeABx(fs,OP_LOADK,reg,luaK_numberK(fs,e->u.nval));
break;
}
case VRELOCABLE:{
Instruction*pc=&getcode(fs,e);
SETARG_A(*pc,reg);
break;
}
case VNONRELOC:{
if(reg!=e->u.s.info)
luaK_codeABC(fs,OP_MOVE,reg,e->u.s.info,0);
break;
}
default:{
return;
}
}
e->u.s.info=reg;
e->k=VNONRELOC;
}